

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

ArenaStringPtr * __thiscall
google::protobuf::internal::GeneratedMessageReflection::
GetRaw<google::protobuf::internal::ArenaStringPtr>
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  long lVar1;
  uint uVar2;
  long *plVar3;
  
  lVar1 = *(long *)(field + 0x60);
  if ((lVar1 == 0) ||
     (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
              (ulong)(uint)((int)((ulong)(lVar1 - *(long *)(*(long *)(lVar1 + 0x10) + 0x40)) >> 4) *
                            -0x55555554 + (this->schema_).oneof_case_offset_)) ==
      *(int *)(field + 0x38))) {
    uVar2 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
  }
  else {
    if (field[0x50] == (FieldDescriptor)0x0) {
      plVar3 = (long *)(*(long *)(field + 0x58) + 0x30);
    }
    else if (*(long *)(field + 0x68) == 0) {
      plVar3 = (long *)(*(long *)(field + 0x30) + 0x98);
    }
    else {
      plVar3 = (long *)(*(long *)(field + 0x68) + 0x80);
    }
    message = (this->schema_).default_instance_;
    uVar2 = (this->schema_).offsets_[(int)((ulong)((long)field - *plVar3) >> 3) * 0x3cf3cf3d];
  }
  return (ArenaStringPtr *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2);
}

Assistant:

const Type& GeneratedMessageReflection::GetRaw(
    const Message& message, const FieldDescriptor* field) const {
  if (field->containing_oneof() && !HasOneofField(message, field)) {
    return DefaultRaw<Type>(field);
  }
  return GetConstRefAtOffset<Type>(message, schema_.GetFieldOffset(field));
}